

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnnTrainer.cpp
# Opt level: O0

void __thiscall tfs::DnnTrainer::setupSums(DnnTrainer *this,bool xsum)

{
  undefined8 *puVar1;
  TMatrix<double> *this_00;
  void *cc;
  byte in_SIL;
  unsigned_long in_RDI;
  Trainable *trainable;
  unsigned_long count;
  Trainable **trainableEnd;
  Trainable **trainableHandle;
  unsigned_long in_stack_ffffffffffffffa8;
  TMatrix<double> *in_stack_ffffffffffffffc0;
  undefined8 *local_18;
  
  puVar1 = *(undefined8 **)(in_RDI + 0x50);
  local_18 = *(undefined8 **)(in_RDI + 0x48);
  while (local_18 < puVar1) {
    TTrainable<double>::weightCount((TTrainable<double> *)*local_18);
    local_18 = local_18 + 1;
  }
  this_00 = (TMatrix<double> *)operator_new(0x50);
  TMatrix<double>::TMatrix
            (in_stack_ffffffffffffffc0,in_RDI,(unsigned_long)this_00,in_stack_ffffffffffffffa8,
             0x127bbd);
  *(TMatrix<double> **)(in_RDI + 0x70) = this_00;
  TMatrix<double>::zero(this_00);
  if ((in_SIL & 1) != 0) {
    cc = operator_new(0x50);
    TMatrix<double>::TMatrix
              (in_stack_ffffffffffffffc0,in_RDI,(unsigned_long)this_00,(unsigned_long)cc,0x127c0b);
    *(void **)(in_RDI + 0x78) = cc;
    TMatrix<double>::zero(this_00);
  }
  return;
}

Assistant:

void
    DnnTrainer::setupSums( bool xsum ) {
        Trainable **trainableHandle = m_trainable_handle;
        Trainable **trainableEnd    = m_trainable_end;
        unsigned long count         = 0;
        while( trainableHandle < trainableEnd ) {
            Trainable *trainable = *trainableHandle++;
            count += trainable->weightCount();
        }
        m_gsum = new Matrix( count );
        m_gsum->zero();
        if( xsum ) {
            m_xsum = new Matrix( count );
            m_xsum->zero();
        }
        return;
    }